

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

int BeliefValue::GetMaximizingVectorIndex(BeliefInterface *b,VectorSet *v)

{
  size_type sVar1;
  int k;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vector<double,_std::allocator<double>_> Vb;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  sVar1 = v->size1_;
  (*b->_vptr_BeliefInterface[0x11])(&local_28,b);
  auVar5 = ZEXT816(0xffefffffffffffff);
  uVar3 = 0;
  for (uVar2 = 0; (uint)sVar1 != uVar2; uVar2 = uVar2 + 1) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_28._M_impl.super__Vector_impl_data._M_start[uVar2];
    dVar4 = auVar5._0_8_;
    auVar5 = vmaxsd_avx(auVar6,auVar5);
    if (dVar4 < local_28._M_impl.super__Vector_impl_data._M_start[uVar2]) {
      uVar3 = uVar2 & 0xffffffff;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  return (int)uVar3;
}

Assistant:

int
BeliefValue::GetMaximizingVectorIndex(const BeliefInterface &b, 
                                      const VectorSet &v)
{
    int nrInV=v.size1();
    int maximizingVectorI=0;
    double maxVal;

    // compute value of b for every vector in VS
    vector<double> Vb=b.InnerProduct(v);

    // find maximizing vector, ignores effects of duplicate values
    maxVal=-DBL_MAX;
    for(int k=0;k!=nrInV;k++)
    {
        if(Vb[k]>maxVal)
        {
            maxVal=Vb[k];
            maximizingVectorI=k;
        }
    }

    return(maximizingVectorI);
}